

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_socket.c
# Opt level: O2

void accept_callback(void *context,cio_epoll_error error)

{
  int __fd;
  cio_error cVar1;
  cio_socket *socket;
  uint *puVar2;
  socklen_t addrlen;
  sockaddr_storage addr;
  
  if (error == CIO_EPOLL_SUCCESS) {
    addr.__ss_padding[0x6e] = '\0';
    addr.__ss_padding[0x6f] = '\0';
    addr.__ss_padding[0x70] = '\0';
    addr.__ss_padding[0x71] = '\0';
    addr.__ss_padding[0x72] = '\0';
    addr.__ss_padding[0x73] = '\0';
    addr.__ss_padding[0x74] = '\0';
    addr.__ss_padding[0x75] = '\0';
    addr.__ss_align = 0;
    addr.__ss_padding[0x5e] = '\0';
    addr.__ss_padding[0x5f] = '\0';
    addr.__ss_padding[0x60] = '\0';
    addr.__ss_padding[0x61] = '\0';
    addr.__ss_padding[0x62] = '\0';
    addr.__ss_padding[99] = '\0';
    addr.__ss_padding[100] = '\0';
    addr.__ss_padding[0x65] = '\0';
    addr.__ss_padding[0x66] = '\0';
    addr.__ss_padding[0x67] = '\0';
    addr.__ss_padding[0x68] = '\0';
    addr.__ss_padding[0x69] = '\0';
    addr.__ss_padding[0x6a] = '\0';
    addr.__ss_padding[0x6b] = '\0';
    addr.__ss_padding[0x6c] = '\0';
    addr.__ss_padding[0x6d] = '\0';
    addr.__ss_padding[0x4e] = '\0';
    addr.__ss_padding[0x4f] = '\0';
    addr.__ss_padding[0x50] = '\0';
    addr.__ss_padding[0x51] = '\0';
    addr.__ss_padding[0x52] = '\0';
    addr.__ss_padding[0x53] = '\0';
    addr.__ss_padding[0x54] = '\0';
    addr.__ss_padding[0x55] = '\0';
    addr.__ss_padding[0x56] = '\0';
    addr.__ss_padding[0x57] = '\0';
    addr.__ss_padding[0x58] = '\0';
    addr.__ss_padding[0x59] = '\0';
    addr.__ss_padding[0x5a] = '\0';
    addr.__ss_padding[0x5b] = '\0';
    addr.__ss_padding[0x5c] = '\0';
    addr.__ss_padding[0x5d] = '\0';
    addr.__ss_padding[0x3e] = '\0';
    addr.__ss_padding[0x3f] = '\0';
    addr.__ss_padding[0x40] = '\0';
    addr.__ss_padding[0x41] = '\0';
    addr.__ss_padding[0x42] = '\0';
    addr.__ss_padding[0x43] = '\0';
    addr.__ss_padding[0x44] = '\0';
    addr.__ss_padding[0x45] = '\0';
    addr.__ss_padding[0x46] = '\0';
    addr.__ss_padding[0x47] = '\0';
    addr.__ss_padding[0x48] = '\0';
    addr.__ss_padding[0x49] = '\0';
    addr.__ss_padding[0x4a] = '\0';
    addr.__ss_padding[0x4b] = '\0';
    addr.__ss_padding[0x4c] = '\0';
    addr.__ss_padding[0x4d] = '\0';
    addr.__ss_padding[0x2e] = '\0';
    addr.__ss_padding[0x2f] = '\0';
    addr.__ss_padding[0x30] = '\0';
    addr.__ss_padding[0x31] = '\0';
    addr.__ss_padding[0x32] = '\0';
    addr.__ss_padding[0x33] = '\0';
    addr.__ss_padding[0x34] = '\0';
    addr.__ss_padding[0x35] = '\0';
    addr.__ss_padding[0x36] = '\0';
    addr.__ss_padding[0x37] = '\0';
    addr.__ss_padding[0x38] = '\0';
    addr.__ss_padding[0x39] = '\0';
    addr.__ss_padding[0x3a] = '\0';
    addr.__ss_padding[0x3b] = '\0';
    addr.__ss_padding[0x3c] = '\0';
    addr.__ss_padding[0x3d] = '\0';
    addr.__ss_padding[0x1e] = '\0';
    addr.__ss_padding[0x1f] = '\0';
    addr.__ss_padding[0x20] = '\0';
    addr.__ss_padding[0x21] = '\0';
    addr.__ss_padding[0x22] = '\0';
    addr.__ss_padding[0x23] = '\0';
    addr.__ss_padding[0x24] = '\0';
    addr.__ss_padding[0x25] = '\0';
    addr.__ss_padding[0x26] = '\0';
    addr.__ss_padding[0x27] = '\0';
    addr.__ss_padding[0x28] = '\0';
    addr.__ss_padding[0x29] = '\0';
    addr.__ss_padding[0x2a] = '\0';
    addr.__ss_padding[0x2b] = '\0';
    addr.__ss_padding[0x2c] = '\0';
    addr.__ss_padding[0x2d] = '\0';
    addr.__ss_padding[0xe] = '\0';
    addr.__ss_padding[0xf] = '\0';
    addr.__ss_padding[0x10] = '\0';
    addr.__ss_padding[0x11] = '\0';
    addr.__ss_padding[0x12] = '\0';
    addr.__ss_padding[0x13] = '\0';
    addr.__ss_padding[0x14] = '\0';
    addr.__ss_padding[0x15] = '\0';
    addr.__ss_padding[0x16] = '\0';
    addr.__ss_padding[0x17] = '\0';
    addr.__ss_padding[0x18] = '\0';
    addr.__ss_padding[0x19] = '\0';
    addr.__ss_padding[0x1a] = '\0';
    addr.__ss_padding[0x1b] = '\0';
    addr.__ss_padding[0x1c] = '\0';
    addr.__ss_padding[0x1d] = '\0';
    addr.ss_family = 0;
    addr.__ss_padding[0] = '\0';
    addr.__ss_padding[1] = '\0';
    addr.__ss_padding[2] = '\0';
    addr.__ss_padding[3] = '\0';
    addr.__ss_padding[4] = '\0';
    addr.__ss_padding[5] = '\0';
    addr.__ss_padding[6] = '\0';
    addr.__ss_padding[7] = '\0';
    addr.__ss_padding[8] = '\0';
    addr.__ss_padding[9] = '\0';
    addr.__ss_padding[10] = '\0';
    addr.__ss_padding[0xb] = '\0';
    addr.__ss_padding[0xc] = '\0';
    addr.__ss_padding[0xd] = '\0';
    addrlen = 0x80;
    __fd = accept4(*(int *)((long)context + 0x20),(sockaddr *)&addr,&addrlen,0x80800);
    if (__fd == -1) {
      puVar2 = (uint *)__errno_location();
      if ((*puVar2 | 2) != 0xb) {
        (**(code **)((long)context + 0x40))
                  (context,*(undefined8 *)((long)context + 0x48),-*puVar2,0);
      }
    }
    else {
      socket = (cio_socket *)(**(code **)((long)context + 0x50))();
      if (socket == (cio_socket *)0x0) {
        (**(code **)((long)context + 0x40))
                  (context,*(undefined8 *)((long)context + 0x48),0xfffffffffffffff4,0);
        close(__fd);
      }
      else {
        cVar1 = cio_linux_socket_init
                          (socket,__fd,*(cio_eventloop **)((long)context + 0x28),*context,
                           *(cio_socket_close_hook_t *)((long)context + 0x58));
        if (cVar1 == CIO_SUCCESS) {
          (**(code **)((long)context + 0x40))
                    (context,*(undefined8 *)((long)context + 0x48),0,socket);
        }
        else {
          (**(code **)((long)context + 0x40))(context,*(undefined8 *)((long)context + 0x48),cVar1,0)
          ;
          close(__fd);
          (**(code **)((long)context + 0x58))(socket);
        }
      }
    }
    return;
  }
  cVar1 = cio_linux_get_socket_error(*(int *)((long)context + 0x20));
  (**(code **)((long)context + 0x40))
            (context,*(undefined8 *)((long)context + 0x48),cVar1,0,*(code **)((long)context + 0x40))
  ;
  return;
}

Assistant:

static void accept_callback(void *context, enum cio_epoll_error error)
{
	struct cio_server_socket *server_socket = context;

	if (cio_unlikely(error != CIO_EPOLL_SUCCESS)) {
		enum cio_error err = cio_linux_get_socket_error(server_socket->impl.ev.fd);
		server_socket->handler(server_socket, server_socket->handler_context, err, NULL);
		return;
	}

	int fd = server_socket->impl.ev.fd;

	struct sockaddr_storage addr;
	memset(&addr, 0, sizeof(addr));
	socklen_t addrlen = sizeof(addr);

	int client_fd = accept4(fd, (struct sockaddr *)&addr, &addrlen, (unsigned int)SOCK_NONBLOCK | (unsigned int)SOCK_CLOEXEC);
	if (cio_unlikely(client_fd == -1)) {
		if ((errno != EAGAIN) && (errno != EBADF)) {
			server_socket->handler(server_socket, server_socket->handler_context, (enum cio_error)(-errno), NULL);
		}
	} else {
		struct cio_socket *client_socket = server_socket->alloc_client();
		if (cio_unlikely(client_socket == NULL)) {
			server_socket->handler(server_socket, server_socket->handler_context, CIO_NO_MEMORY, client_socket);
			close(client_fd);
			return;
		}

		enum cio_error err = cio_linux_socket_init(client_socket, client_fd, server_socket->impl.loop, server_socket->impl.close_timeout_ns, server_socket->free_client);
		if (cio_likely(err == CIO_SUCCESS)) {
			server_socket->handler(server_socket, server_socket->handler_context, err, client_socket);
		} else {
			server_socket->handler(server_socket, server_socket->handler_context, err, NULL);
			close(client_fd);
			server_socket->free_client(client_socket);
		}
	}
}